

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9Texture.cpp
# Opt level: O0

uint32_t __thiscall
GmmLib::GmmGen9TextureCalc::GetMipTailByteOffset
          (GmmGen9TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t MipLevel)

{
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  uint32_t local_20;
  uint32_t Slot;
  uint32_t ByteOffset;
  uint32_t MipLevel_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmGen9TextureCalc *this_local;
  
  local_20 = 0;
  if ((pTexInfo->Type == RESOURCE_1D) || (pTexInfo->Type == RESOURCE_3D)) {
    switch((MipLevel - (pTexInfo->Alignment).MipTailStartLod) +
           (SUB84((pTexInfo->Flags).Info,4) >> 5 & 1) * 4) {
    case 0:
      local_20 = 0x8000;
      break;
    case 1:
      local_20 = 0x4000;
      break;
    case 2:
      local_20 = 0x2000;
      break;
    case 3:
      local_20 = 0x1000;
      break;
    case 4:
      local_20 = 0x800;
      break;
    case 5:
      local_20 = 0x400;
      break;
    case 6:
      local_20 = 0x300;
      break;
    case 7:
      local_20 = 0x200;
      break;
    case 8:
      local_20 = 0x1c0;
      break;
    case 9:
      local_20 = 0x180;
      break;
    case 10:
      local_20 = 0x140;
      break;
    case 0xb:
      local_20 = 0x100;
      break;
    case 0xc:
      local_20 = 0xc0;
      break;
    case 0xd:
      local_20 = 0x80;
      break;
    case 0xe:
      local_20 = 0x40;
      break;
    case 0xf:
      local_20 = 0;
    }
  }
  else if ((pTexInfo->Type == RESOURCE_2D) || (pTexInfo->Type == RESOURCE_CUBE)) {
    if ((((ulong)(pTexInfo->Flags).Info >> 0x26 & 1) == 0) || ((pTexInfo->MSAA).NumSamples != 0x10))
    {
      if ((((ulong)(pTexInfo->Flags).Info >> 0x26 & 1) == 0) || ((pTexInfo->MSAA).NumSamples != 8))
      {
        if ((((ulong)(pTexInfo->Flags).Info >> 0x26 & 1) == 0) || ((pTexInfo->MSAA).NumSamples != 4)
           ) {
          if ((((ulong)(pTexInfo->Flags).Info >> 0x26 & 1) == 0) ||
             ((pTexInfo->MSAA).NumSamples != 2)) {
            if ((SUB84((pTexInfo->Flags).Info,4) >> 6 & 1) == 0) {
              local_48 = 0;
              if ((SUB84((pTexInfo->Flags).Info,4) >> 5 & 1) != 0) {
                local_48 = 4;
              }
            }
            else {
              local_48 = 0;
            }
            local_44 = local_48;
          }
          else {
            local_44 = 1;
          }
          local_40 = local_44;
        }
        else {
          local_40 = 2;
        }
        local_3c = local_40;
      }
      else {
        local_3c = 3;
      }
      local_38 = local_3c;
    }
    else {
      local_38 = 4;
    }
    switch((MipLevel - (pTexInfo->Alignment).MipTailStartLod) + local_38) {
    case 0:
      local_20 = 0x8000;
      break;
    case 1:
      local_20 = 0x4000;
      break;
    case 2:
      local_20 = 0x2000;
      break;
    case 3:
      local_20 = 0x1000;
      break;
    case 4:
      local_20 = 0x800;
      break;
    case 5:
      local_20 = 0x600;
      break;
    case 6:
      local_20 = 0x500;
      break;
    case 7:
      local_20 = 0x400;
      break;
    case 8:
      local_20 = 0x300;
      break;
    case 9:
      local_20 = 0x200;
      break;
    case 10:
      local_20 = 0x100;
      break;
    case 0xb:
      local_20 = 0xc0;
      break;
    case 0xc:
      local_20 = 0x80;
      break;
    case 0xd:
      local_20 = 0x40;
      break;
    case 0xe:
      local_20 = 0;
    }
  }
  return local_20;
}

Assistant:

uint32_t GmmLib::GmmGen9TextureCalc::GetMipTailByteOffset(GMM_TEXTURE_INFO *pTexInfo,
                                                          uint32_t          MipLevel)
{
    uint32_t ByteOffset = 0, Slot;

    GMM_DPF_ENTER;

    if((pTexInfo->Type == RESOURCE_1D) || (pTexInfo->Type == RESOURCE_3D))
    {
        Slot = MipLevel - pTexInfo->Alignment.MipTailStartLod +
               (pTexInfo->Flags.Info.TiledYf ? 4 : 0);

        switch(Slot)
        {
            case 0:
                ByteOffset = GMM_KBYTE(32);
                break;
            case 1:
                ByteOffset = GMM_KBYTE(16);
                break;
            case 2:
                ByteOffset = GMM_KBYTE(8);
                break;
            case 3:
                ByteOffset = GMM_KBYTE(4);
                break;
            case 4:
                ByteOffset = GMM_KBYTE(2);
                break;
            case 5:
                ByteOffset = GMM_KBYTE(1);
                break;
            case 6:
                ByteOffset = GMM_BYTES(768);
                break;
            case 7:
                ByteOffset = GMM_BYTES(512);
                break;
            case 8:
                ByteOffset = GMM_BYTES(448);
                break;
            case 9:
                ByteOffset = GMM_BYTES(384);
                break;
            case 10:
                ByteOffset = GMM_BYTES(320);
                break;
            case 11:
                ByteOffset = GMM_BYTES(256);
                break;
            case 12:
                ByteOffset = GMM_BYTES(192);
                break;
            case 13:
                ByteOffset = GMM_BYTES(128);
                break;
            case 14:
                ByteOffset = GMM_BYTES(64);
                break;
            case 15:
                ByteOffset = GMM_BYTES(0);
                break;
            default:
                __GMM_ASSERT(0);
        }
    }
    else if(pTexInfo->Type == RESOURCE_2D || pTexInfo->Type == RESOURCE_CUBE)
    {
        // clang-format off
        Slot = MipLevel - pTexInfo->Alignment.MipTailStartLod +
                    // TileYs
                   ((pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples == 16) ? 4 :
                    (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples ==  8) ? 3 :
                    (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples ==  4) ? 2 :
                    (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples ==  2) ? 1 :
                    (pTexInfo->Flags.Info.TiledYs                                   ) ? 0 :
                    // TileYf
                    (pTexInfo->Flags.Info.TiledYf                                   ) ?  4: 0);
        // clang-format on

        switch(Slot)
        {
            case 0:
                ByteOffset = GMM_KBYTE(32);
                break;
            case 1:
                ByteOffset = GMM_KBYTE(16);
                break;
            case 2:
                ByteOffset = GMM_KBYTE(8);
                break;
            case 3:
                ByteOffset = GMM_KBYTE(4);
                break;
            case 4:
                ByteOffset = GMM_KBYTE(2);
                break;
            case 5:
                ByteOffset = GMM_BYTES(1536);
                break;
            case 6:
                ByteOffset = GMM_BYTES(1280);
                break;
            case 7:
                ByteOffset = GMM_BYTES(1024);
                break;
            case 8:
                ByteOffset = GMM_BYTES(768);
                break;
            case 9:
                ByteOffset = GMM_BYTES(512);
                break;
            case 10:
                ByteOffset = GMM_BYTES(256);
                break;
            case 11:
                ByteOffset = GMM_BYTES(192);
                break;
            case 12:
                ByteOffset = GMM_BYTES(128);
                break;
            case 13:
                ByteOffset = GMM_BYTES(64);
                break;
            case 14:
                ByteOffset = GMM_BYTES(0);
                break;
            default:
                __GMM_ASSERT(0);
        }
    }

    GMM_DPF_EXIT;

    return (ByteOffset);
}